

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O3

void __thiscall SingleFileMuxer::writeOutBuffer(SingleFileMuxer *this,StreamInfo *streamInfo)

{
  MuxerManager *pMVar1;
  uint8_t *buff;
  LPCMStreamReader *this_00;
  int iVar2;
  uint8_t *__dest;
  ostream *poVar3;
  undefined4 *puVar4;
  size_t __n;
  SingleFileMuxer *__src;
  StreamInfo *pSVar5;
  string newName;
  ostringstream ss;
  uint *local_208;
  undefined8 local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  iVar2 = streamInfo->m_bufLen;
  __src = (SingleFileMuxer *)streamInfo;
  if (0x1fffff < iVar2) {
    pMVar1 = (this->super_AbstractMuxer).m_owner;
    if (pMVar1->m_asyncMode == true) {
      __dest = (uint8_t *)operator_new__(0x208000);
      buff = streamInfo->m_buffer;
      memcpy(__dest,buff + 0x200000,(ulong)(iVar2 - 0x200000));
      __src = this;
      MuxerManager::asyncWriteBuffer
                (pMVar1,&this->super_AbstractMuxer,buff,0x200000,(AbstractOutputStream *)streamInfo)
      ;
      streamInfo->m_buffer = __dest;
    }
    else {
      MuxerManager::syncWriteBuffer
                (pMVar1,&this->super_AbstractMuxer,streamInfo->m_buffer,0x200000,
                 (AbstractOutputStream *)streamInfo);
      __src = (SingleFileMuxer *)(streamInfo->m_buffer + 0x200000);
      memmove(streamInfo->m_buffer,__src,(long)streamInfo->m_bufLen - 0x200000);
    }
    streamInfo->m_totalWrited = streamInfo->m_totalWrited + 0x200000;
    streamInfo->m_bufLen = streamInfo->m_bufLen + -0x200000;
  }
  iVar2 = (int)__src;
  this_00 = (LPCMStreamReader *)streamInfo->m_codecReader;
  if (((this_00 != (LPCMStreamReader *)0x0) &&
      ((this_00->super_SimplePacketizerReader).super_AbstractStreamReader.
       super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader ==
       (_func_int **)&PTR__SimplePacketizerReader_0023dbe0)) &&
     (0xffde < streamInfo->m_totalWrited >> 0x10)) {
    pMVar1 = (this->super_AbstractMuxer).m_owner;
    if (pMVar1->m_asyncMode == true) {
      MuxerManager::waitForWriting(pMVar1);
    }
    File::close(&streamInfo->m_file,iVar2);
    __n = 0;
    File::open(&streamInfo->m_file,(streamInfo->m_fileName)._M_dataplus._M_p,6);
    iVar2 = (int)streamInfo->m_buffer;
    File::write(&streamInfo->m_file,iVar2,(void *)(ulong)(uint)streamInfo->m_bufLen,__n);
    File::close(&streamInfo->m_file,iVar2);
    File::open(&streamInfo->m_file,(streamInfo->m_fileName)._M_dataplus._M_p,0x22,0);
    pSVar5 = streamInfo;
    LPCMStreamReader::beforeFileCloseEvent(this_00,&streamInfo->m_file);
    File::close(&streamInfo->m_file,(int)pSVar5);
    getNewName(&local_1c8,&streamInfo->m_fileName,streamInfo->m_part);
    deleteFile(&local_1c8);
    iVar2 = rename((streamInfo->m_fileName)._M_dataplus._M_p,local_1c8._M_dataplus._M_p);
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Can\'t rename file ",0x12);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(streamInfo->m_fileName)._M_dataplus._M_p,
                          (streamInfo->m_fileName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," to ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar4 = 3;
      *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
      if (local_1e8 == &local_1d8) {
        puVar4[6] = local_1d8;
        puVar4[7] = uStack_1d4;
        puVar4[8] = uStack_1d0;
        puVar4[9] = uStack_1cc;
      }
      else {
        *(uint **)(puVar4 + 2) = local_1e8;
        *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1d4,local_1d8);
      }
      *(undefined8 *)(puVar4 + 4) = local_1e0;
      local_1e0 = 0;
      local_1d8 = local_1d8 & 0xffffff00;
      local_1e8 = &local_1d8;
      __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    streamInfo->m_part = streamInfo->m_part + 1;
    streamInfo->m_bufLen = 0;
    iVar2 = File::open(&streamInfo->m_file,(streamInfo->m_fileName)._M_dataplus._M_p,2,0);
    if ((char)iVar2 == '\0') {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Can\'t open file ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(streamInfo->m_fileName)._M_dataplus._M_p,
                 (streamInfo->m_fileName)._M_string_length);
      puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar4 = 3;
      *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
      if (local_208 == &local_1f8) {
        puVar4[6] = local_1f8;
        puVar4[7] = uStack_1f4;
        puVar4[8] = uStack_1f0;
        puVar4[9] = uStack_1ec;
      }
      else {
        *(uint **)(puVar4 + 2) = local_208;
        *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1f4,local_1f8);
      }
      *(undefined8 *)(puVar4 + 4) = local_200;
      local_1f8 = local_1f8 & 0xffffff00;
      __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    this_00->m_firstFrame = true;
    streamInfo->m_totalWrited = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void SingleFileMuxer::writeOutBuffer(StreamInfo* streamInfo)
{
    constexpr int blockSize = DEFAULT_FILE_BLOCK_SIZE;
    if (streamInfo->m_bufLen >= blockSize)
    {
        constexpr int toFileLen = blockSize & 0xffff0000;
        if (m_owner->isAsyncMode())
        {
            const auto newBuf = new uint8_t[blockSize + MAX_AV_PACKET_SIZE];
            memcpy(newBuf, streamInfo->m_buffer + toFileLen, streamInfo->m_bufLen - toFileLen);
            m_owner->asyncWriteBuffer(this, streamInfo->m_buffer, toFileLen, &streamInfo->m_file);
            streamInfo->m_buffer = newBuf;
        }
        else
        {
            m_owner->syncWriteBuffer(this, streamInfo->m_buffer, toFileLen, &streamInfo->m_file);
            memmove(streamInfo->m_buffer, streamInfo->m_buffer + toFileLen, streamInfo->m_bufLen - toFileLen);
        }
        streamInfo->m_totalWrited += toFileLen;
        streamInfo->m_bufLen -= toFileLen;
    }

    const auto lpcmReader = dynamic_cast<LPCMStreamReader*>(streamInfo->m_codecReader);
    if (lpcmReader && streamInfo->m_totalWrited >= 0xffff0000ul - blockSize)
    // if (lpcmReader && streamInfo->m_totalWrited >= 0x0ffffffful)
    {
        if (m_owner->isAsyncMode())
            m_owner->waitForWriting();
        streamInfo->m_file.close();
        streamInfo->m_file.open(streamInfo->m_fileName.c_str(), File::ofWrite + File::ofAppend);
        streamInfo->m_file.write(streamInfo->m_buffer, streamInfo->m_bufLen);
        streamInfo->m_file.close();
        streamInfo->m_file.open(streamInfo->m_fileName.c_str(), File::ofWrite + File::ofNoTruncate);
        lpcmReader->beforeFileCloseEvent(streamInfo->m_file);
        streamInfo->m_file.close();
        const std::string newName = getNewName(streamInfo->m_fileName, streamInfo->m_part);
        deleteFile(newName);
        if (rename(streamInfo->m_fileName.c_str(), newName.c_str()) != 0)
            THROW(ERR_COMMON, "Can't rename file " << streamInfo->m_fileName << " to " << newName)
        streamInfo->m_part++;
        int systemFlags = 0;
        streamInfo->m_bufLen = 0;
#ifdef _WIN32
        if (m_owner->isAsyncMode())
            systemFlags += FILE_FLAG_NO_BUFFERING;
#endif
        if (!streamInfo->m_file.open(streamInfo->m_fileName.c_str(), File::ofWrite + systemFlags))
            THROW(ERR_COMMON, "Can't open file " << streamInfo->m_fileName)
        lpcmReader->setFirstFrame(true);
        streamInfo->m_totalWrited = 0;
    }
}